

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(data_view *data,DataType baseType,string *val)

{
  complex<double> val_00;
  uint uVar1;
  int in_ESI;
  data_view *in_stack_00000118;
  NamedPoint npv;
  long value_1;
  double value;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffe30;
  vector<double,_std::allocator<double>_> *this;
  undefined4 in_stack_fffffffffffffe38;
  data_view *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  vector<double,_std::allocator<double>_> local_128 [2];
  string *in_stack_ffffffffffffff08;
  defV *in_stack_ffffffffffffff10;
  double local_a0;
  
  if (in_ESI == -1) goto LAB_003a35c5;
  if (in_ESI != 0) {
    if (in_ESI == 1) {
      ValueConverter<double>::interpret((data_view *)in_stack_fffffffffffffe20);
      helicsDoubleString_abi_cxx11_((double)in_stack_fffffffffffffe30);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe20);
      return;
    }
    if (in_ESI == 2) {
LAB_003a353d:
      ValueConverter<long>::interpret((data_view *)in_stack_fffffffffffffe20);
      helicsIntString_abi_cxx11_((int64_t)in_stack_fffffffffffffe30);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe20);
      return;
    }
    if (in_ESI == 3) {
      ValueConverter<std::complex<double>_>::interpret((data_view *)in_stack_fffffffffffffe20);
      val_00._M_value._8_4_ = in_stack_fffffffffffffe38;
      val_00._M_value._0_8_ = in_stack_fffffffffffffe30;
      val_00._M_value._12_4_ = in_ESI;
      helicsComplexString_abi_cxx11_(val_00);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe20);
      return;
    }
    if (in_ESI == 4) {
      this = local_128;
      ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
                ((data_view *)CONCAT44(4,in_stack_fffffffffffffe38));
      helicsVectorString_abi_cxx11_
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe70);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe20);
      CLI::std::vector<double,_std::allocator<double>_>::~vector(this);
      return;
    }
    if (in_ESI == 5) {
      ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
      interpret((data_view *)CONCAT44(5,in_stack_fffffffffffffe38));
      helicsComplexVectorString_abi_cxx11_
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffe70);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe20);
      CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                (in_stack_fffffffffffffe30);
      return;
    }
    if (in_ESI == 6) {
      ValueConverter<helics::NamedPoint>::interpret
                ((data_view *)CONCAT44(6,in_stack_fffffffffffffe38));
      uVar1 = std::isnan(local_a0);
      if ((uVar1 & 1) == 0) {
        helicsNamedPointString_abi_cxx11_
                  ((NamedPoint *)
                   CONCAT44(in_ESI,CONCAT13((char)uVar1,(int3)in_stack_fffffffffffffe38)));
      }
      else {
        std::__cxx11::string::string(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe20);
      NamedPoint::~NamedPoint((NamedPoint *)0x3a3695);
      return;
    }
    if (in_ESI != 7) {
      if (in_ESI == 8) goto LAB_003a353d;
      if (in_ESI != 9) {
        if (in_ESI != 0x19) {
          if (in_ESI == 0x1e) {
            readJsonValue_abi_cxx11_(in_stack_00000118);
            valueExtract(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            CLI::std::
            variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
            ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                        *)0x3a3852);
            return;
          }
          if (in_ESI != 0x21) {
            if (in_ESI != 0x62ae) {
              return;
            }
            goto LAB_003a358e;
          }
        }
LAB_003a35c5:
        data_view::string_abi_cxx11_(in_stack_fffffffffffffe48);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        std::__cxx11::string::~string(in_stack_fffffffffffffe20);
        return;
      }
    }
  }
LAB_003a358e:
  ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
            ((data_view *)in_stack_fffffffffffffe20);
  std::__cxx11::string::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::string& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            auto value = ValueConverter<double>::interpret(data);
            val = helicsDoubleString(value);
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            auto value = ValueConverter<int64_t>::interpret(data);
            val = helicsIntString(value);
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        case DataType::HELICS_BOOL:
        case DataType::HELICS_ANY:
            val = ValueConverter<std::string_view>::interpret(data);
            break;
        case DataType::HELICS_UNKNOWN:
        case DataType::HELICS_CUSTOM:
        case DataType::HELICS_MULTI:
            val = data.string();
            break;
        case DataType::HELICS_NAMED_POINT: {
            auto npv = ValueConverter<NamedPoint>::interpret(data);
            val = std::isnan(npv.value) ? npv.name : helicsNamedPointString(npv);
            break;
        }
        case DataType::HELICS_VECTOR:
            val = helicsVectorString(ValueConverter<std::vector<double>>::interpret(data));
            break;
        case DataType::HELICS_COMPLEX:
            val = helicsComplexString(ValueConverter<std::complex<double>>::interpret(data));
            break;
        case DataType::HELICS_COMPLEX_VECTOR:
            val = helicsComplexVectorString(
                ValueConverter<std::vector<std::complex<double>>>::interpret(data));
            break;
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}